

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O0

ndn_hmac_key_t * ndn_key_storage_get_empty_hmac_key(void)

{
  byte local_11;
  uint8_t i;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  local_11 = 0;
  while( true ) {
    if (9 < local_11) {
      return (ndn_hmac_key_t *)0x0;
    }
    if (storage.hmac_keys[local_11].key_id == 0xffffffff) break;
    local_11 = local_11 + 1;
  }
  return storage.hmac_keys + local_11;
}

Assistant:

ndn_hmac_key_t*
ndn_key_storage_get_empty_hmac_key(void)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.hmac_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      return &storage.hmac_keys[i];
    }
  }
  return NULL;
}